

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O3

ktx_error_code_e ktxFileStream_read(ktxStream *str,void *dst,ktx_size_t count)

{
  int iVar1;
  ktx_error_code_e kVar2;
  size_t sVar3;
  
  kVar2 = KTX_INVALID_VALUE;
  if (dst != (void *)0x0 && str != (ktxStream *)0x0) {
    if (str->type != eStreamTypeFile) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0x55,
                    "ktx_error_code_e ktxFileStream_read(ktxStream *, void *, const ktx_size_t)");
    }
    sVar3 = fread(dst,1,count,(FILE *)(str->data).file);
    if (sVar3 == count) {
      str->readpos = str->readpos + count;
      kVar2 = KTX_SUCCESS;
    }
    else {
      iVar1 = feof((FILE *)(str->data).file);
      kVar2 = (uint)(iVar1 != 0) * 2 + KTX_FILE_READ_ERROR;
    }
  }
  return kVar2;
}

Assistant:

static
KTX_error_code ktxFileStream_read(ktxStream* str, void* dst, const ktx_size_t count)
{
    ktx_size_t nread;

    if (!str || !dst)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    if ((nread = fread(dst, 1, count, str->data.file)) != count) {
        if (feof(str->data.file)) {
            return KTX_FILE_UNEXPECTED_EOF;
        } else {
            return KTX_FILE_READ_ERROR;
        }
    }
    str->readpos += count;

    return KTX_SUCCESS;
}